

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  int iVar1;
  uint64_t uVar2;
  int64_t iVar3;
  int in_EDX;
  long in_RDI;
  int i;
  secp256k1_int128 d;
  secp256k1_int128 c;
  uint64_t M62;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  int64_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  secp256k1_int128 *in_stack_ffffffffffffffd0;
  
  secp256k1_i128_from_i64((secp256k1_int128 *)&stack0xffffffffffffffc8,0);
  for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
    if (iVar4 < in_EDX) {
      secp256k1_i128_accum_mul
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
    uVar2 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffc8);
    *(uint64_t *)(in_RDI + (long)iVar4 * 8) = uVar2 & 0x3fffffffffffffff;
    secp256k1_i128_rshift
              ((secp256k1_int128 *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  }
  if (4 < in_EDX) {
    secp256k1_i128_accum_mul
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  iVar3 = secp256k1_i128_to_i64((secp256k1_int128 *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
  secp256k1_i128_from_i64((secp256k1_int128 *)&stack0xffffffffffffffb8,iVar3);
  iVar1 = secp256k1_i128_eq_var
                    ((secp256k1_int128 *)&stack0xffffffffffffffc8,
                     (secp256k1_int128 *)&stack0xffffffffffffffb8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x34,"test condition failed: secp256k1_i128_eq_var(&c, &d)");
    abort();
  }
  iVar3 = secp256k1_i128_to_i64((secp256k1_int128 *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
  *(int64_t *)(in_RDI + 0x20) = iVar3;
  return;
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}